

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundMutation.cpp
# Opt level: O3

void __thiscall CompoundMutation::print(CompoundMutation *this,ostream *os)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  pointer psVar4;
  ulong uVar5;
  long lVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"HEALTH SHARE ",0xd);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,(this->super_MutationComponent).health)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," / 100",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"PRODUCTIVITY SHARE ",0x13);
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)os,(this->super_MutationComponent).productivity);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," / 100",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"SIZE SWITCH ",0xc);
  plVar3 = (long *)std::ostream::operator<<((ostream *)os,(this->super_MutationComponent).size);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"SAFETY SWITCH ",0xe);
  plVar3 = (long *)std::ostream::operator<<((ostream *)os,(this->super_MutationComponent).safety);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"VELOCITY SWITCH ",0x10);
  plVar3 = (long *)std::ostream::operator<<((ostream *)os,(this->super_MutationComponent).velocity);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"COVER SWITCH ",0xd);
  plVar3 = (long *)std::ostream::operator<<((ostream *)os,(this->super_MutationComponent).cover);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"~~~~~~~~~~~~~~~CHILDREN_BEGIN~~~~~~~~~~~~~~~~~~",0x2f);
  cVar1 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  psVar4 = (this->children).
           super__Vector_base<std::shared_ptr<MutationComponent>,_std::allocator<std::shared_ptr<MutationComponent>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<std::shared_ptr<MutationComponent>,_std::allocator<std::shared_ptr<MutationComponent>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar4) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      plVar3 = *(long **)((long)&(psVar4->
                                 super___shared_ptr<MutationComponent,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar6);
      (**(code **)(*plVar3 + 8))(plVar3,os);
      uVar5 = uVar5 + 1;
      psVar4 = (this->children).
               super__Vector_base<std::shared_ptr<MutationComponent>,_std::allocator<std::shared_ptr<MutationComponent>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (ulong)((long)(this->children).
                                   super__Vector_base<std::shared_ptr<MutationComponent>,_std::allocator<std::shared_ptr<MutationComponent>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"~~~~~~~~~~~~~~~CHILDREN_END~~~~~~~~~~~~~~~~~~",0x2d);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void CompoundMutation::print(std::ostream &os) {
  os << "HEALTH SHARE " << health << " / 100" << std::endl;
  os << "PRODUCTIVITY SHARE " << productivity << " / 100" << std::endl;
  os << "SIZE SWITCH " << size << std::endl;
  os << "SAFETY SWITCH " << safety << std::endl;
  os << "VELOCITY SWITCH " << velocity << std::endl;
  os << "COVER SWITCH " << cover << std::endl;
  os << "~~~~~~~~~~~~~~~CHILDREN_BEGIN~~~~~~~~~~~~~~~~~~" << std::endl;
  for (int i = 0; i < children.size(); ++i) {
    children[i]->print(os);
  }
  os << "~~~~~~~~~~~~~~~CHILDREN_END~~~~~~~~~~~~~~~~~~" << std::endl;
}